

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_noop(NetOptimize *this)

{
  int iVar1;
  bool bVar2;
  reference ppLVar3;
  reference pvVar4;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  unsigned_long *puVar8;
  reference pvVar9;
  long in_RDI;
  int top_blob_index_final_1;
  int k_1;
  size_t top_blob_count;
  Layer *any;
  int j;
  int bottom_blob_index;
  int top_blob_index_final;
  int k;
  size_t top_blob_count_1;
  Layer *noop;
  int i;
  size_t layer_count;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  FILE *in_stack_ffffffffffffff80;
  FILE *in_stack_ffffffffffffff90;
  int local_5c;
  size_type local_58;
  size_type local_50;
  ulong local_48;
  value_type local_40;
  int local_38;
  value_type local_34;
  int local_30;
  int local_2c;
  ulong local_28;
  value_type local_20;
  int local_14;
  ulong local_10;
  
  local_10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_14 = 0;
  do {
    if (local_10 <= (ulong)(long)local_14) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_14);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff80,
                            (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar2) {
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_14);
      local_20 = *ppLVar3;
      bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90);
      if (bVar2) {
        in_stack_ffffffffffffff90 = _stderr;
        uVar6 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffff90,"eliminate_noop %s\n",uVar6);
        local_28 = std::vector<int,_std::allocator<int>_>::size(&local_20->tops);
        for (local_2c = 0; (ulong)(long)local_2c < local_28; local_2c = local_2c + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_20->tops,(long)local_2c);
          local_30 = *pvVar4;
          pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                             ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                              (long)local_30);
          pvVar9->producer = -1;
        }
        std::__cxx11::string::operator=((string *)&local_20->type,"ncnnfused");
      }
      else {
        ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_14);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar3)->bottoms,0);
        local_34 = *pvVar4;
        local_38 = local_14;
        do {
          do {
            do {
              local_38 = local_38 + -1;
              if (local_38 < 0) goto LAB_00120c8c;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         (long)local_38);
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffff80,
                                      (char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                       in_stack_ffffffffffffff78));
            } while (bVar2);
            ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 0x40),(long)local_38);
            sVar5 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar3)->tops);
          } while (sVar5 != 1);
          ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_38);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar3)->tops,0);
        } while (*pvVar4 != local_34);
LAB_00120c8c:
        if (local_38 != -1) {
          ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_38);
          local_40 = *ppLVar3;
          in_stack_ffffffffffffff80 = _stderr;
          uVar6 = std::__cxx11::string::c_str();
          uVar7 = std::__cxx11::string::c_str();
          fprintf(in_stack_ffffffffffffff80,"eliminate_noop %s %s\n",uVar6,uVar7);
          local_50 = std::vector<int,_std::allocator<int>_>::size(&local_20->tops);
          local_58 = std::vector<int,_std::allocator<int>_>::size(&local_40->tops);
          puVar8 = std::min<unsigned_long>(&local_50,&local_58);
          local_48 = *puVar8;
          for (local_5c = 0; (ulong)(long)local_5c < local_48; local_5c = local_5c + 1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_20->tops,(long)local_5c);
            iVar1 = *pvVar4;
            in_stack_ffffffffffffff78 = iVar1;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_40->tops,(long)local_5c);
            *pvVar4 = in_stack_ffffffffffffff78;
            in_stack_ffffffffffffff7c = local_38;
            pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                               ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                                (long)iVar1);
            pvVar9->producer = in_stack_ffffffffffffff7c;
          }
          std::__cxx11::string::operator=((string *)&local_20->type,"ncnnfused");
        }
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_noop()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Noop")
            continue;

        ncnn::Layer* noop = layers[i];

        if (noop->bottoms.empty())
        {
            // Noop
            fprintf(stderr, "eliminate_noop %s\n", noop->name.c_str());

            size_t top_blob_count = noop->tops.size();
            for (int k=0; k<top_blob_count; k++)
            {
                int top_blob_index_final = noop->tops[k];
                blobs[top_blob_index_final].producer = -1;
            }
            noop->type = "ncnnfused";

            continue;
        }

        // Any - Noop
        int bottom_blob_index = layers[i]->bottoms[0];

        int j = i - 1;
        for (; j>=0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            if (layers[j]->tops.size() != 1)
                continue;

            if (layers[j]->tops[0] == bottom_blob_index)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_noop %s %s\n", any->name.c_str(), noop->name.c_str());

        size_t top_blob_count = std::min(noop->tops.size(), any->tops.size());
        for (int k=0; k<top_blob_count; k++)
        {
            int top_blob_index_final = noop->tops[k];
            any->tops[k] = top_blob_index_final;
            blobs[top_blob_index_final].producer = j;
        }
        noop->type = "ncnnfused";
    }

    return 0;
}